

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::GenerateBuilderParsingCode
          (ImmutableEnumOneofFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  bool bVar1;
  MessageLite *pMVar2;
  EnumDescriptor *pEVar3;
  char *pcVar4;
  size_t sVar5;
  string_view text;
  
  this_00 = (this->super_ImmutableEnumFieldGenerator).descriptor_;
  pMVar2 = protobuf::internal::ExtensionSet::GetMessage
                     (&(this_00->merged_features_->field_0)._impl_._extensions_,pb::java,
                      (MessageLite *)PTR__JavaFeatures_default_instance__00855a30);
  if (*(char *)((long)&pMVar2[1]._internal_metadata_.ptr_ + 4) == '\0') {
    pEVar3 = FieldDescriptor::enum_type(this_00);
    if (pEVar3 != (EnumDescriptor *)0x0) {
      pEVar3 = FieldDescriptor::enum_type(this_00);
      bVar1 = EnumDescriptor::is_closed(pEVar3);
      if (!bVar1) {
        pcVar4 = 
        "int rawValue = input.readEnum();\n$set_oneof_case_message$;\n$oneof_name$_ = rawValue;\n";
        sVar5 = 0x55;
        goto LAB_0036f7fc;
      }
    }
  }
  pcVar4 = 
  "int rawValue = input.readEnum();\n$type$ value =\n    $type$.forNumber(rawValue);\nif (value == null) {\n  mergeUnknownVarintField($number$, rawValue);\n} else {\n  $set_oneof_case_message$;\n  $oneof_name$_ = rawValue;\n}\n"
  ;
  sVar5 = 0xd7;
LAB_0036f7fc:
  text._M_str = pcVar4;
  text._M_len = sVar5;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutableEnumFieldGenerator).variables_,text);
  return;
}

Assistant:

void ImmutableEnumOneofFieldGenerator::GenerateBuilderParsingCode(
    io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_)) {
    printer->Print(variables_,
                   "int rawValue = input.readEnum();\n"
                   "$set_oneof_case_message$;\n"
                   "$oneof_name$_ = rawValue;\n");
  } else {
    printer->Print(variables_,
                   "int rawValue = input.readEnum();\n"
                   "$type$ value =\n"
                   "    $type$.forNumber(rawValue);\n"
                   "if (value == null) {\n"
                   "  mergeUnknownVarintField($number$, rawValue);\n"
                   "} else {\n"
                   "  $set_oneof_case_message$;\n"
                   "  $oneof_name$_ = rawValue;\n"
                   "}\n");
  }
}